

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xcard_mt.cpp
# Opt level: O2

vector<bool,_std::allocator<bool>_> * __thiscall
xcardMT::validateFromFile
          (vector<bool,_std::allocator<bool>_> *__return_storage_ptr__,xcardMT *this,ifstream *fp)

{
  thread *this_00;
  undefined4 uVar1;
  undefined1 auVar2 [12];
  undefined1 *puVar3;
  ifstream *piVar4;
  vector<bool,std::allocator<bool>> *this_01;
  void *pvVar5;
  uint uVar6;
  istream *piVar7;
  ostream *poVar8;
  ulong uVar9;
  size_t sVar10;
  undefined8 *puVar11;
  ulong uVar12;
  int iVar13;
  undefined4 *puVar14;
  long lVar15;
  undefined8 *puVar16;
  void *__s;
  int iVar17;
  int iVar18;
  size_t i;
  const_iterator __position;
  _Bit_iterator __first;
  undefined8 uStack_110;
  undefined1 local_108 [8];
  string buf;
  undefined4 uStack_cc;
  undefined1 auStack_c8 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  card_storage;
  xcardMT *local_a8;
  vector<bool,_std::allocator<bool>_> *local_a0;
  undefined1 *local_98;
  size_t local_90;
  undefined4 *local_88;
  undefined1 *local_80;
  thread local_78;
  ifstream *local_70;
  ulong local_68;
  ulong local_60;
  undefined8 *local_58;
  vector<bool,std::allocator<bool>> *local_50;
  void *local_48;
  int local_3c;
  xcardMT *local_38;
  
  local_108 = (undefined1  [8])&buf._M_string_length;
  buf._M_dataplus._M_p = (pointer)0x0;
  (__return_storage_ptr__->super__Bvector_base<std::allocator<bool>_>)._M_impl.
  super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  (__return_storage_ptr__->super__Bvector_base<std::allocator<bool>_>)._M_impl.
  super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset = 0;
  (__return_storage_ptr__->super__Bvector_base<std::allocator<bool>_>)._M_impl.
  super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  (__return_storage_ptr__->super__Bvector_base<std::allocator<bool>_>)._M_impl.
  super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset = 0;
  (__return_storage_ptr__->super__Bvector_base<std::allocator<bool>_>)._M_impl.
  super__Bvector_impl_data._M_end_of_storage = (_Bit_pointer)0x0;
  buf._M_string_length._0_1_ = 0;
  iVar17 = 0;
  local_50 = (vector<bool,std::allocator<bool>> *)__return_storage_ptr__;
  local_38 = this;
  while( true ) {
    uStack_110 = 0x10607b;
    piVar7 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)fp,(string *)local_108);
    if (((byte)piVar7[*(long *)(*(long *)piVar7 + -0x18) + 0x20] & 5) != 0) break;
    iVar17 = iVar17 + 1;
  }
  uStack_110 = 0x10609f;
  std::ios::clear((int)*(undefined8 *)(*(long *)fp + -0x18) + (int)fp);
  uStack_110 = 0x1060ab;
  std::istream::seekg((long)fp,_S_beg);
  local_70 = fp;
  uVar6 = local_38->max_threads;
  if ((int)uVar6 < 1) {
    uStack_110 = 0x1060bf;
    uVar6 = std::thread::hardware_concurrency();
    local_38->max_threads = uVar6;
  }
  uVar12 = (ulong)uVar6;
  local_68 = uVar12;
  lVar15 = -(uVar12 * 0x28 + 0xf & 0xfffffffffffffff0);
  puVar16 = (undefined8 *)(local_108 + lVar15);
  if (uVar6 != 0) {
    puVar11 = puVar16;
    do {
      *puVar11 = 0;
      *(undefined4 *)(puVar11 + 1) = 0;
      puVar11[2] = 0;
      *(undefined4 *)(puVar11 + 3) = 0;
      puVar11[4] = 0;
      puVar11 = puVar11 + 5;
    } while (puVar11 != puVar16 + uVar12 * 5);
  }
  local_58 = puVar16;
  if ((local_38->super_xcard).debug != 0) {
    *(undefined8 *)((long)&uStack_110 + lVar15) = 0x10612f;
    poVar8 = std::operator<<((ostream *)&std::cout,"[DEBUG] TotalLines=");
    *(undefined8 *)((long)&uStack_110 + lVar15) = 0x10613a;
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,iVar17);
    *(undefined8 *)((long)&uStack_110 + lVar15) = 0x106142;
    std::endl<char,std::char_traits<char>>(poVar8);
    *(undefined8 *)((long)&uStack_110 + lVar15) = 0x106155;
    poVar8 = std::operator<<((ostream *)&std::cout,"[DEBUG] max_threads=");
    iVar18 = local_38->max_threads;
    *(undefined8 *)((long)&uStack_110 + lVar15) = 0x106164;
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,iVar18);
    *(undefined8 *)((long)&uStack_110 + lVar15) = 0x10616c;
    std::endl<char,std::char_traits<char>>(poVar8);
  }
  local_80 = local_108;
  local_88 = (undefined4 *)((long)&buf + lVar15 + 0x10);
  do {
    uVar6 = local_38->max_threads;
    uVar12 = (ulong)uVar6;
    iVar18 = iVar17 / (int)uVar6;
    if (iVar17 / (int)uVar6 <= (int)uVar6) {
      local_38->max_threads = 1;
      puVar16[-1] = 1;
      uVar12 = puVar16[-1];
      iVar18 = iVar17;
    }
    __s = (void *)((long)puVar16 - ((uVar12 & 0xffffffff) * 8 + 0xf & 0xfffffffffffffff0));
    sVar10 = (uVar12 & 0xffffffff) * 8;
    local_98 = (undefined1 *)puVar16;
    local_90 = sVar10;
    local_48 = __s;
    local_3c = iVar17;
    *(undefined8 *)((long)__s + -8) = 0x1061da;
    memset(__s,0,sVar10);
    if (iVar18 < 1) {
      iVar18 = 0;
    }
    uVar12 = 0;
    while (uVar9 = (ulong)local_38->max_threads, uVar12 < uVar9) {
      auStack_c8 = (undefined1  [8])0x0;
      card_storage.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      card_storage.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      iVar17 = 0;
      local_60 = uVar12;
      while ((piVar4 = local_70, iVar13 = iVar18, iVar18 != iVar17 &&
             (iVar13 = iVar17,
             ((byte)*(istream *)(local_70 + *(long *)(*(long *)local_70 + -0x18) + 0x20) & 2) == 0))
            ) {
        *(undefined8 *)((long)__s + -8) = 0x106237;
        std::getline<char,std::char_traits<char>,std::allocator<char>>
                  ((istream *)piVar4,(string *)local_108);
        *(undefined8 *)((long)__s + -8) = 0x106246;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)auStack_c8,(value_type *)local_108);
        iVar17 = iVar17 + 1;
      }
      buf.field_2._8_8_ = runner;
      local_a8 = local_38;
      local_a0 = (vector<bool,_std::allocator<bool>_> *)(local_58 + local_60 * 5);
      *(undefined8 *)((long)__s + -8) = 0x1062a6;
      std::thread::
      thread<void(xcardMT::*)(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<bool,std::allocator<bool>>*),xcardMT*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::vector<bool,std::allocator<bool>>*,void>
                (&local_78,(type *)(buf.field_2._M_local_buf + 8),&local_a8,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)auStack_c8,&local_a0);
      this_00 = (thread *)((long)local_48 + local_60 * 8);
      *(undefined8 *)((long)__s + -8) = 0x1062bb;
      std::thread::operator=(this_00,&local_78);
      *(undefined8 *)((long)__s + -8) = 0x1062c4;
      std::thread::~thread(&local_78);
      local_3c = local_3c - iVar13;
      *(undefined8 *)((long)__s + -8) = 0x1062cf;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)auStack_c8);
      uVar12 = local_60 + 1;
    }
    puVar14 = local_88;
    for (uVar12 = 0; pvVar5 = local_48, uVar12 < (ulong)(long)(int)uVar9; uVar12 = uVar12 + 1) {
      *(undefined8 *)((long)__s + -8) = 0x1062f5;
      std::thread::join();
      this_01 = local_50;
      auVar2 = *(undefined1 (*) [12])(local_50 + 0x10);
      uVar9 = *(ulong *)(puVar14 + -6);
      uVar1 = *puVar14;
      *(undefined8 *)((long)__s + -0x10) = *(undefined8 *)(puVar14 + -2);
      *(ulong *)((long)__s + -8) = CONCAT44(uStack_cc,uVar1);
      *(undefined8 *)((long)__s + -0x18) = 0x106330;
      __position.super__Bit_iterator_base._12_4_ = 0;
      __position.super__Bit_iterator_base._0_12_ = auVar2;
      __first.super__Bit_iterator_base._8_8_ = 0;
      __first.super__Bit_iterator_base._M_p = (_Bit_type *)uVar9;
      std::vector<bool,std::allocator<bool>>::insert<std::_Bit_iterator,void>
                (this_01,__position,__first,
                 (_Bit_iterator)*(_Bit_iterator_base *)((long)__s + -0x10));
      uVar9 = (ulong)(uint)local_38->max_threads;
      puVar14 = puVar14 + 10;
    }
    uVar6 = *(uint *)(local_70 + *(long *)(*(long *)local_70 + -0x18) + 0x20);
    sVar10 = local_90;
    do {
      *(undefined8 *)((long)__s + -8) = 0x106370;
      std::thread::~thread((thread *)((long)pvVar5 + (sVar10 - 8)));
      puVar11 = local_58;
      puVar3 = local_98;
      sVar10 = sVar10 - 8;
    } while (sVar10 != 0);
    puVar16 = (undefined8 *)local_98;
    iVar17 = local_3c;
  } while ((uVar6 & 2) == 0);
  if (local_68 != 0) {
    lVar15 = local_68 * 0x28;
    do {
      *(undefined8 *)(puVar3 + -8) = 0x1063ab;
      std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base
                ((_Bvector_base<std::allocator<bool>_> *)((long)puVar11 + lVar15 + -0x28));
      lVar15 = lVar15 + -0x28;
    } while (lVar15 != 0);
  }
  *(undefined8 *)(local_80 + -8) = 0x1063c1;
  std::__cxx11::string::~string((string *)local_108);
  return (vector<bool,_std::allocator<bool>_> *)local_50;
}

Assistant:

std::vector<bool> xcardMT::validateFromFile(std::ifstream &fp)
{

    //declare buf to store string from file!
    std::string buf;

    //to join indv. results from threads.
    std::vector<bool> final_result;

    //counter vars
    int line_counter = 0;

    //initial line counting
    while (getline(fp, buf))
    {
        line_counter++;
    }

    //clear and reset file
    fp.clear();
    fp.seekg(0, std::ios::beg);

    //init. threads and results vector.

    //if max_threads < 0 set to no of cpu of system.
    if (this->max_threads <= 0){
        this->max_threads = std::thread::hardware_concurrency();
    }


    std::vector<bool> results[this->max_threads];

    if (this->debug)
    {
        std::cout << "[DEBUG] TotalLines=" << line_counter << std::endl;
        std::cout << "[DEBUG] max_threads=" << this->max_threads << std::endl;
    }


    while(true){

        //set max_threads and per_thread;
        long int per_thread = line_counter / this->max_threads;

        if (per_thread <= this->max_threads){
            this->max_threads = 1;
            per_thread = line_counter;
        }

        std::thread threads[this->max_threads];
        
        //debug
        //std::cout << "per_thread= " << per_thread << " max_threads=" << this->max_threads << std::endl;

        for (size_t thread_id = 0; thread_id < this->max_threads; thread_id++)
        {
            //declare storage
            std::vector<std::string> card_storage;

            int pt_counter = 0;

            //get lines and store in storage (check for eof)
        while (pt_counter < per_thread && !fp.eof())
        {
            getline(fp, buf);
            card_storage.push_back(buf);
            pt_counter++;
        }

        //dispatch
        threads[thread_id] = std::thread(&xcardMT::runner, this, card_storage, &results[thread_id]);
        line_counter -= pt_counter;

        }

        //join and add result to final_result
        for (size_t i = 0; i < this->max_threads; i++)
        {
            threads[i].join();
            final_result.insert(final_result.end(), results[i].begin(), results[i].end());
        }
        

        //if not eof - continue
        if(fp.eof()){
            break;
        }else{
            continue;
        }


    } //end while

    return final_result;
}